

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_typed_array_join(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,
                           int toLocaleString)

{
  uint uVar1;
  int iVar2;
  uint32_t c;
  ulong uVar3;
  JSValue JVar4;
  JSValue JVar5;
  JSValueUnion local_68;
  StringBuffer local_50;
  
  uVar1 = js_typed_array_get_length_internal(ctx,this_val);
  if ((int)uVar1 < 0) {
    JVar5 = (JSValue)(ZEXT816(6) << 0x40);
  }
  else {
    c = 0x2c;
    JVar5 = (JSValue)(ZEXT816(3) << 0x40);
    if (0 < argc && toLocaleString == 0) {
      JVar5 = (JSValue)(ZEXT816(3) << 0x40);
      if ((int)argv->tag != 3) {
        JVar5.tag = argv->tag;
        JVar5.u.ptr = (argv->u).ptr;
        JVar5 = JS_ToStringInternal(ctx,JVar5,0);
        if ((int)JVar5.tag == 6) {
LAB_0016bf73:
          return (JSValue)(ZEXT816(6) << 0x40);
        }
        if (*(int *)((long)JVar5.u.ptr + 4) == 1) {
          c = (uint32_t)*(byte *)((long)JVar5.u.ptr + 0x10);
        }
        else {
          c = 0xffffffff;
        }
      }
    }
    local_50.len = 0;
    local_50.size = 0;
    local_50.is_wide_char = 0;
    local_50.error_status = 0;
    local_50.ctx = ctx;
    local_50.str = js_alloc_string(ctx,0,0);
    if (local_50.str == (JSString *)0x0) {
      local_50._16_8_ = local_50._16_8_ & 0xffffffff;
      local_50.error_status = -1;
    }
    local_68 = JVar5.u;
    if (uVar1 != 0) {
      uVar3 = 0;
      do {
        if (uVar3 != 0) {
          if ((int)c < 0) {
            iVar2 = string_buffer_concat
                              (&local_50,(JSString *)local_68.ptr,0,
                               *(uint *)((long)local_68.ptr + 4) & 0x7fffffff);
          }
          else {
            iVar2 = string_buffer_putc8(&local_50,c);
          }
          if (iVar2 == 0) goto LAB_0016be99;
LAB_0016bf1f:
          (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
          if ((0xfffffff4 < (uint)JVar5.tag) &&
             (iVar2 = *local_68.ptr, *(int *)local_68.ptr = iVar2 + -1, iVar2 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar5);
          }
          goto LAB_0016bf73;
        }
LAB_0016be99:
        JVar4.tag = 0;
        JVar4.u.ptr = (void *)uVar3;
        JVar4 = JS_GetPropertyValue(ctx,this_val,JVar4);
        if (1 < (int)JVar4.tag - 2U) {
          if ((int)JVar4.tag != 6) {
            if (toLocaleString != 0) {
              JVar4 = JS_ToLocaleStringFree(ctx,JVar4);
            }
            iVar2 = string_buffer_concat_value_free(&local_50,JVar4);
            if (iVar2 == 0) goto LAB_0016bedd;
          }
          goto LAB_0016bf1f;
        }
LAB_0016bedd:
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
    if ((0xfffffff4 < (uint)JVar5.tag) &&
       (iVar2 = *local_68.ptr, *(int *)local_68.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar5);
    }
    JVar5 = string_buffer_end(&local_50);
  }
  return JVar5;
}

Assistant:

static JSValue js_typed_array_join(JSContext *ctx, JSValueConst this_val,
                                   int argc, JSValueConst *argv, int toLocaleString)
{
    JSValue sep = JS_UNDEFINED, el;
    StringBuffer b_s, *b = &b_s;
    JSString *p = NULL;
    int i, n;
    int c;

    n = js_typed_array_get_length_internal(ctx, this_val);
    if (n < 0)
        goto exception;

    c = ',';    /* default separator */
    if (!toLocaleString && argc > 0 && !JS_IsUndefined(argv[0])) {
        sep = JS_ToString(ctx, argv[0]);
        if (JS_IsException(sep))
            goto exception;
        p = JS_VALUE_GET_STRING(sep);
        if (p->len == 1 && !p->is_wide_char)
            c = p->u.str8[0];
        else
            c = -1;
    }
    string_buffer_init(ctx, b, 0);

    /* XXX: optimize with direct access */
    for(i = 0; i < n; i++) {
        if (i > 0) {
            if (c >= 0) {
                if (string_buffer_putc8(b, c))
                    goto fail;
            } else {
                if (string_buffer_concat(b, p, 0, p->len))
                    goto fail;
            }
        }
        el = JS_GetPropertyUint32(ctx, this_val, i);
        /* Can return undefined for example if the typed array is detached */
        if (!JS_IsNull(el) && !JS_IsUndefined(el)) {
            if (JS_IsException(el))
                goto fail;
            if (toLocaleString) {
                el = JS_ToLocaleStringFree(ctx, el);
            }
            if (string_buffer_concat_value_free(b, el))
                goto fail;
        }
    }
    JS_FreeValue(ctx, sep);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
    JS_FreeValue(ctx, sep);
exception:
    return JS_EXCEPTION;
}